

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O2

void __thiscall
soplex::
LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPRowBase(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_lhs,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *p_rowVector,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *p_rhs,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_obj)

{
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this,&p_lhs->m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->right).m_backend,&p_rhs->m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->object).m_backend,&p_obj->m_backend);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->vec,p_rowVector);
  return;
}

Assistant:

LPRowBase(const R& p_lhs, const SVectorBase<R>& p_rowVector, const R& p_rhs, const R& p_obj = 0)
      : left(p_lhs), right(p_rhs), object(p_obj), vec(p_rowVector)
   {
      assert(isConsistent());
   }